

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_generator.cpp
# Opt level: O0

void __thiscall franca::ModelGenerator::ModelGenerator(ModelGenerator *this)

{
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>
  local_5a58;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>_&>,_2L>
  local_5a48;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>_&>,_2L>_&>,_1L>
  local_5a38;
  char local_5a2c;
  bool_<false> local_5a2b;
  terminal<boost::spirit::tag::bool_> local_5a2a [2];
  terminal<boost::spirit::tag::bool_> *local_5a28;
  terminal<boost::spirit::tag::bool_> **local_5a20;
  char *local_5a18;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::TypeGenerator_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  local_5a10;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::TypeGenerator_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_5a00;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::TypeGenerator_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_59f0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::TypeGenerator_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>_&>,_2L>_&>,_1L>_&>,_2L>
  local_59e0;
  undefined1 local_59c9;
  char *local_59c8;
  karma_rule<fidler::ast::Argument_()> *local_59c0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_59b8;
  expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>
  local_59a8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  local_59a0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>_>,_2L>
  local_5990;
  bool_<false> local_597b;
  terminal<boost::spirit::tag::bool_> local_597a [2];
  terminal<boost::spirit::tag::bool_> *local_5978;
  terminal<boost::spirit::tag::bool_> **local_5970;
  char *local_5968;
  char *local_5960;
  TypeGenerator *local_5958;
  char **local_5950;
  undefined1 ***local_5948;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_5940;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>
  local_5930;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::InitializerGenerator_&>,_2L>
  local_5920;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_franca::InitializerGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_&>,_2L>
  local_5910;
  char *local_5900;
  karma_rule<std::vector<fidler::ast::Argument>_()> *local_58f8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>
  local_58f0;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>_&>,_1L>
  local_58e0;
  bool_<false> local_58d3;
  terminal<boost::spirit::tag::bool_> local_58d2 [2];
  terminal<boost::spirit::tag::bool_> *local_58d0;
  terminal<boost::spirit::tag::bool_> **local_58c8;
  char *local_58c0;
  char *local_58b8;
  undefined1 *local_58b0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>_>,_2L>_&>,_2L>
  local_58a8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  local_5898;
  expr<_192c4ac2_> local_5888;
  expr<_fc3650f8_> local_5878;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>
  local_5868;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>
  local_5858;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::ExpressionGenerator_&>,_2L>_&>,_1L>_&>,_2L>
  local_5850;
  undefined1 local_5839;
  char *local_5838;
  karma_rule<fidler::ast::Enumerator_()> *local_5830;
  char **local_5828;
  undefined1 *local_5820;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>
  local_5818;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  local_5810;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>
  local_5800;
  char local_57e9;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_57e8;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>_>,_2L>_&>,_2L>
  local_57d8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_57c8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>
  local_57b8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&>,_2L>
  local_57a8;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&>,_2L>_&>,_1L>
  local_5798;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_5790;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>
  local_5780;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>_&>,_1L>
  local_5770;
  char *local_5768;
  karma_rule<std::vector<fidler::ast::Argument>_()> *local_5760;
  undefined1 *local_5758;
  char **local_5750;
  undefined1 **local_5748;
  bool_<false> local_573b;
  terminal<boost::spirit::tag::bool_> local_573a [2];
  terminal<boost::spirit::tag::bool_> *local_5738;
  terminal<boost::spirit::tag::bool_> **local_5730;
  char *local_5728;
  AnnotationGenerator *local_5720;
  char *local_5718;
  AnnotationGenerator **local_5710;
  undefined1 *local_5708;
  AnnotationGenerator ***local_5700;
  undefined1 ***local_56f8;
  undefined8 ***local_56f0;
  char *local_56e8;
  expr<_729e463c_> local_56e0;
  expr<_11b61f56_> local_56d0;
  expr<_71954927_> local_56c0;
  expr<_7d951473_> local_56b0;
  bool_<false> local_569b;
  terminal<boost::spirit::tag::bool_> local_569a [2];
  expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>
  local_5698;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[17]>,_0L>_>,_2L>
  local_5690;
  bool_<false> local_567b;
  terminal<boost::spirit::tag::bool_> local_567a [2];
  terminal<boost::spirit::tag::bool_> *local_5678;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>_>,_2L>
  local_5670;
  undefined1 local_565c;
  bool_<false> local_565b;
  terminal<boost::spirit::tag::bool_> local_565a [2];
  terminal<boost::spirit::tag::bool_> *local_5658;
  terminal<boost::spirit::tag::bool_> **local_5650;
  char *local_5648;
  AnnotationGenerator *local_5640;
  char *local_5638;
  AnnotationGenerator **local_5630;
  TypeGenerator *local_5628;
  AnnotationGenerator ***local_5620;
  undefined1 ***local_5618;
  undefined8 ***local_5610;
  undefined1 *local_5608;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::AnnotationGenerator_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&,_franca::TypeGenerator_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_5600;
  expr<_7e997403_> local_55f0;
  expr<_46e7833c_> local_55e0;
  expr<_92765940_> local_55d0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[19]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_55c0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[19]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>_>,_2L>
  local_55b0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[19]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_55a0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[19]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>
  local_5590;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5580;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionGenerator_&>,_1L>
  local_5578;
  ContractGenerator *local_5570;
  karma_rule<fidler::ast::Broadcast_()> *local_5568;
  karma_rule<fidler::ast::Method_()> *local_5560;
  karma_rule<fidler::ast::Attribute_()> *local_5558;
  karma_rule<fidler::ast::Version_()> *local_5550;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_5548;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  local_5538;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  local_5528;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  *local_5518;
  char *local_5510;
  undefined1 *local_5508;
  char **local_5500;
  AnnotationGenerator *local_54f8;
  char *local_54f0;
  AnnotationGenerator **local_54e8;
  undefined1 *local_54e0;
  AnnotationGenerator ***local_54d8;
  undefined8 **local_54d0;
  undefined8 ***local_54c8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  **local_54c0;
  undefined8 ***local_54b8;
  char *local_54b0;
  undefined8 ***local_54a8;
  karma_rule<fidler::ast::Version_()> **local_54a0;
  undefined8 ***local_5498;
  karma_rule<fidler::ast::Attribute_()> **local_5490;
  undefined8 ***local_5488;
  karma_rule<fidler::ast::Method_()> **local_5480;
  undefined8 ***local_5478;
  karma_rule<fidler::ast::Broadcast_()> **local_5470;
  expr<_c6be378f_> local_5468;
  expr<_3e4dbcd4_> local_5458;
  expr<_e6862e41_> local_5448;
  expr<_c444509b_> local_5438;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5428;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionGenerator_&>,_1L>
  local_5420;
  char *local_5418;
  karma_rule<fidler::ast::Version_()> *local_5410;
  char **local_5408;
  undefined1 local_53f9;
  undefined1 *local_53f8;
  undefined1 *local_53f0;
  undefined1 **local_53e8;
  AnnotationGenerator *local_53e0;
  char *local_53d8;
  AnnotationGenerator **local_53d0;
  undefined1 ***local_53c8;
  AnnotationGenerator ***local_53c0;
  char *local_53b8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::AnnotationGenerator_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_1L>_&>,_2L>
  local_53b0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::AnnotationGenerator_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionGenerator_&>,_1L>_&>,_2L>
  local_53a0;
  expr<_e7458206_> local_5390;
  expr<_aa3caba8_> local_5380;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[20]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_5370;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[20]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_5360;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5350;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5348;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_5340;
  char *local_5338;
  undefined1 *local_5330;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>
  local_5328;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_5318;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_5308;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_52f8;
  allocator local_52e1;
  string local_52e0;
  allocator local_52b9;
  string local_52b8;
  allocator local_5291;
  string local_5290;
  allocator local_5269;
  string local_5268;
  allocator local_5241;
  string local_5240;
  allocator local_5219;
  string local_5218;
  allocator local_51f1;
  string local_51f0;
  allocator local_51c9;
  string local_51c8;
  allocator local_51a1;
  string local_51a0;
  allocator local_5179;
  string local_5178;
  allocator local_5151;
  string local_5150;
  allocator local_5129;
  string local_5128;
  allocator local_5101;
  string local_5100;
  allocator local_50c9;
  string local_50c8;
  ModelGenerator *local_50a8;
  ModelGenerator *this_local;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_5098;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_5090;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_5088;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_5080;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_5070;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_5068;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_5060;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_5058;
  proto_child1 local_5048;
  proto_child0 local_5040;
  proto_child0 local_5038;
  proto_child1 local_5030;
  char *local_5020;
  char **local_5018;
  char **local_5010;
  char *local_5008;
  undefined1 *local_4ff8;
  char *local_4ff0;
  char *local_4fe8;
  undefined1 *local_4fe0;
  karma_rule<std::string_()> *local_4fd0;
  karma_rule<std::string_()> *local_4fc8;
  karma_rule<fidler::ast::TypeCollection_()> *local_4fb8;
  karma_rule<fidler::ast::TypeCollection_()> *local_4fb0;
  karma_rule<fidler::ast::Interface_()> *local_4fa0;
  karma_rule<fidler::ast::Interface_()> *local_4f98;
  char *local_4f88;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[20]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_4f80;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[20]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  *local_4f78;
  char *local_4f70;
  undefined1 *local_4f60;
  char *local_4f58;
  char *local_4f50;
  proto_child1 local_4f48;
  char *local_4f38;
  expr<_e7458206_> *local_4f30;
  expr<_e7458206_> *local_4f28;
  proto_child0 local_4f20;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_4f10;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::AnnotationGenerator_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionGenerator_&>,_1L>_&>,_2L>
  *local_4f08;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<franca::AnnotationGenerator_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<franca::TypeDefinitionGenerator_&>,_1L>_&>,_2L>
  *local_4f00;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_4ef8;
  proto_child1 local_4ee8;
  proto_child0 local_4ee0;
  proto_child0 local_4ed8;
  proto_child1 local_4ed0;
  undefined8 **local_4ec0;
  undefined8 ***local_4eb8;
  undefined8 ***local_4eb0;
  undefined8 **local_4ea8;
  char *local_4e98;
  AnnotationGenerator ***local_4e90;
  AnnotationGenerator ***local_4e88;
  char *local_4e80;
  undefined1 ***local_4e70;
  AnnotationGenerator **local_4e68;
  AnnotationGenerator **local_4e60;
  undefined1 ***local_4e58;
  char *local_4e48;
  AnnotationGenerator *local_4e40;
  AnnotationGenerator *local_4e38;
  char *local_4e30;
  undefined1 **local_4e20;
  undefined1 **local_4e18;
  undefined1 *local_4e08;
  char *local_4e00;
  char *local_4df8;
  proto_child1 local_4df0;
  undefined1 *local_4de0;
  undefined1 *local_4dd8;
  undefined1 *local_4dd0;
  undefined1 *local_4dc8;
  char **local_4db8;
  char **local_4db0;
  karma_rule<fidler::ast::Version_()> *local_4da0;
  char *local_4d98;
  char *local_4d90;
  karma_rule<fidler::ast::Version_()> *local_4d88;
  TypeDefinitionGenerator *local_4d78;
  TypeDefinitionGenerator *local_4d70;
  TypeDefinitionGenerator *local_4d60;
  TypeDefinitionGenerator *local_4d58;
  karma_rule<fidler::ast::ConstantDef_()> *local_4d48;
  karma_rule<fidler::ast::ConstantDef_()> *local_4d40;
  karma_rule<fidler::ast::ConstantDef_()> *local_4d30;
  karma_rule<fidler::ast::ConstantDef_()> *local_4d28;
  char *local_4d18;
  expr<_e6862e41_> *local_4d10;
  expr<_e6862e41_> *local_4d08;
  proto_child0 local_4d00;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_4cf0;
  expr<_3e4dbcd4_> *local_4ce8;
  expr<_3e4dbcd4_> *local_4ce0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_4cd8;
  proto_child1 local_4cc8;
  proto_child0 local_4cc0;
  proto_child0 local_4cb8;
  proto_child1 local_4cb0;
  ContractGenerator **local_4ca0;
  undefined8 ***local_4c98;
  undefined8 ***local_4c90;
  ContractGenerator **local_4c88;
  karma_rule<fidler::ast::Broadcast_()> **local_4c78;
  undefined8 ***local_4c70;
  undefined8 ***local_4c68;
  karma_rule<fidler::ast::Broadcast_()> **local_4c60;
  karma_rule<fidler::ast::Method_()> **local_4c50;
  undefined8 ***local_4c48;
  undefined8 ***local_4c40;
  karma_rule<fidler::ast::Method_()> **local_4c38;
  karma_rule<fidler::ast::Attribute_()> **local_4c28;
  undefined8 ***local_4c20;
  undefined8 ***local_4c18;
  karma_rule<fidler::ast::Attribute_()> **local_4c10;
  karma_rule<fidler::ast::Version_()> **local_4c00;
  undefined8 ***local_4bf8;
  undefined8 ***local_4bf0;
  karma_rule<fidler::ast::Version_()> **local_4be8;
  char *local_4bd8;
  undefined8 ***local_4bd0;
  undefined8 ***local_4bc8;
  char *local_4bc0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  **local_4bb0;
  undefined8 ***local_4ba8;
  undefined8 ***local_4ba0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  **local_4b98;
  undefined8 **local_4b88;
  AnnotationGenerator ***local_4b80;
  AnnotationGenerator ***local_4b78;
  undefined8 **local_4b70;
  undefined1 *local_4b60;
  AnnotationGenerator **local_4b58;
  AnnotationGenerator **local_4b50;
  undefined1 *local_4b48;
  char *local_4b38;
  AnnotationGenerator *local_4b30;
  AnnotationGenerator *local_4b28;
  char *local_4b20;
  char **local_4b10;
  char **local_4b08;
  undefined1 *local_4af8;
  char *local_4af0;
  char *local_4ae8;
  undefined1 *local_4ae0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  *local_4ad0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  *local_4ac8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  *local_4ac0;
  undefined1 *local_4ab8;
  undefined1 *local_4ab0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  that_43;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>
  that_101;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>
  that_144;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>
  that_106;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&>,_2L>
  that_113;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>_&>,_2L>
  that_178;
  expr_type that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>
  that_1;
  expr_type that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>
  that_3;
  expr_type that_4;
  expr_type that_5;
  expr_type that_6;
  expr_type that_7;
  expr_type that_8;
  expr_type that_9;
  expr_type that_10;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[20]>,_0L>
  that_11;
  expr_type that_12;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_13;
  expr_type that_14;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>
  that_15;
  expr_type that_16;
  expr_type that_118;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_119;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_17;
  expr_type that_18;
  expr_type that_19;
  expr_type that_20;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_21;
  expr_type that_22;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_23;
  expr_type that_24;
  expr_type that_25;
  expr_type that_26;
  expr_type that_58;
  expr_type that_27;
  expr_type that_28;
  expr_type that_60;
  expr_type that_29;
  expr_type that_30;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_31;
  expr_type that_32;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>
  that_33;
  expr_type that_34;
  expr_type that_35;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_36;
  expr_type that_37;
  expr_type that_38;
  expr_type that_39;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_40;
  expr_type that_41;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_42;
  undefined1 local_2e49;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  *local_2e48;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>
  *local_2e40;
  undefined1 *local_2e38;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&>,_2L>
  *local_2e28;
  expr_type that_44;
  expr_type that_45;
  expr_type that_46;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_47;
  expr_type that_48;
  expr_type that_49;
  expr_type that_50;
  expr_type that_51;
  expr_type that_52;
  expr_type that_53;
  expr_type that_54;
  expr_type that_55;
  expr_type that_56;
  expr_type that_57;
  expr_type that_59;
  expr_type that_61;
  expr_type that_62;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_63;
  expr_type that_64;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[19]>,_0L>
  that_65;
  expr_type that_66;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_67;
  expr_type that_68;
  expr_type that_69;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_70;
  expr_type that_71;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>
  that_72;
  expr_type that_73;
  expr_type that_74;
  expr_type that_81;
  expr_type that_85;
  expr_type that_93;
  expr_type that_136;
  expr_type that_151;
  expr_type that_169;
  expr_type that_75;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_76;
  expr_type that_152;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_153;
  expr_type that_170;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_171;
  expr_type that_77;
  expr_type that_78;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_79;
  expr_type that_80;
  expr_type that_82;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_83;
  expr_type that_84;
  expr_type that_86;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[17]>,_0L>
  that_87;
  expr_type that_88;
  expr_type that_89;
  expr_type that_90;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_91;
  expr_type that_92;
  expr_type that_94;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>
  that_95;
  expr_type that_96;
  expr_type that_97;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_98;
  expr_type that_99;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_100;
  expr_type that_102;
  expr_type that_103;
  expr_type that_104;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_105;
  expr_type that_142;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_143;
  undefined1 local_15c1;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_15c0;
  undefined1 local_15b1;
  char **local_15b0;
  char **local_15a8;
  undefined1 *local_15a0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_1598;
  undefined1 *local_1590;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_2L>
  *local_1580;
  expr_type that_107;
  expr_type that_145;
  expr_type that_108;
  expr_type that_109;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>
  that_110;
  expr_type that_111;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>
  that_112;
  undefined1 local_1329;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>
  *local_1328;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>
  *local_1320;
  undefined1 *local_1318;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[10]>,_0L>,_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[2]>,_0L>_>,_2L>_&>,_2L>
  *local_1308;
  expr_type that_114;
  expr_type that_115;
  expr_type that_116;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_117;
  expr_type that_120;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_121;
  expr_type that_122;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_123;
  expr_type that_124;
  expr_type that_125;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_126;
  expr_type that_127;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_128;
  expr_type that_129;
  expr_type that_130;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_131;
  expr_type that_132;
  expr_type that_133;
  expr_type that_134;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>
  that_135;
  expr_type that_137;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>
  that_138;
  expr_type that_139;
  expr_type that_140;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_141;
  expr_type that_146;
  expr_type that_147;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_148;
  expr_type that_149;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>
  that_150;
  expr_type that_154;
  expr_type that_155;
  expr_type that_156;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_157;
  expr_type that_158;
  expr_type that_159;
  expr_type that_160;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_161;
  expr_type that_162;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_163;
  expr_type that_164;
  expr_type that_165;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_166;
  expr_type that_167;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_168;
  expr_type that_172;
  expr_type that_173;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_174;
  expr_type that_175;
  expr_type that_176;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_177;
  undefined1 local_d9;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>
  *local_d8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>
  *local_d0;
  undefined1 *local_c8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::buffer>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_franca::InitializerGenerator_&>,_2L>_&>,_2L>
  *local_b8;
  expr_type that_179;
  expr_type that_180;
  
  local_50a8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50c8,"unnamed-grammar",&local_50c9);
  boost::spirit::karma::
  grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->super_karma_grammar<fidler::ast::Model_()>,&this->model_,&local_50c8);
  std::__cxx11::string::~string((string *)&local_50c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_50c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5100,"unnamed-rule",&local_5101);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->model_,&local_5100);
  std::__cxx11::string::~string((string *)&local_5100);
  std::allocator<char>::~allocator((allocator<char> *)&local_5101);
  AnnotationGenerator::AnnotationGenerator(&this->annotation_);
  TypeGenerator::TypeGenerator(&this->type_);
  TypeDefinitionGenerator::TypeDefinitionGenerator(&this->type_definition_);
  InitializerGenerator::InitializerGenerator(&this->initializer_);
  ContractGenerator::ContractGenerator(&this->contract_);
  ExpressionGenerator::ExpressionGenerator(&this->expression_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5128,"unnamed-rule",&local_5129);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->import_,&local_5128);
  std::__cxx11::string::~string((string *)&local_5128);
  std::allocator<char>::~allocator((allocator<char> *)&local_5129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5150,"unnamed-rule",&local_5151);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->version_,&local_5150);
  std::__cxx11::string::~string((string *)&local_5150);
  std::allocator<char>::~allocator((allocator<char> *)&local_5151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5178,"unnamed-rule",&local_5179);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->attribute_,&local_5178);
  std::__cxx11::string::~string((string *)&local_5178);
  std::allocator<char>::~allocator((allocator<char> *)&local_5179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_51a0,"unnamed-rule",&local_51a1);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->argument_,&local_51a0);
  std::__cxx11::string::~string((string *)&local_51a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_51a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_51c8,"unnamed-rule",&local_51c9);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_std::vector<fidler::ast::Argument,_std::allocator<fidler::ast::Argument>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->argument_list_,&local_51c8);
  std::__cxx11::string::~string((string *)&local_51c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_51c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_51f0,"unnamed-rule",&local_51f1);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->error_,&local_51f0);
  std::__cxx11::string::~string((string *)&local_51f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_51f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5218,"unnamed-rule",&local_5219);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->enumerator_,&local_5218);
  std::__cxx11::string::~string((string *)&local_5218);
  std::allocator<char>::~allocator((allocator<char> *)&local_5219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5240,"unnamed-rule",&local_5241);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->method_,&local_5240);
  std::__cxx11::string::~string((string *)&local_5240);
  std::allocator<char>::~allocator((allocator<char> *)&local_5241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5268,"unnamed-rule",&local_5269);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->broadcast_,&local_5268);
  std::__cxx11::string::~string((string *)&local_5268);
  std::allocator<char>::~allocator((allocator<char> *)&local_5269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5290,"unnamed-rule",&local_5291);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->constant_def_,&local_5290);
  std::__cxx11::string::~string((string *)&local_5290);
  std::allocator<char>::~allocator((allocator<char> *)&local_5291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_52b8,"unnamed-rule",&local_52b9);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_collection_,&local_52b8);
  std::__cxx11::string::~string((string *)&local_52b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_52b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_52e0,"unnamed-rule",&local_52e1);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->interface_,&local_52e0);
  std::__cxx11::string::~string((string *)&local_52e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_52e1);
  local_4ff0 = "package ";
  local_4ff8 = &boost::spirit::standard::string;
  local_5338 = "package ";
  local_5330 = &boost::spirit::standard::string;
  local_5328.child0 = (proto_child0)&local_5338;
  local_5020 = "\n";
  local_5328.child1.child0 = (proto_child0)0x147d458;
  local_5340.child0 = &this->import_;
  local_5318.child0 = &local_5328;
  local_5318.child1 = &local_5340;
  local_5348.child0 = &this->type_collection_;
  local_5308.child0 = &local_5318;
  local_5308.child1 = &local_5348;
  local_5350.child0 = &this->interface_;
  local_52f8.child0 = &local_5308;
  local_52f8.child1 = &local_5350;
  local_5098 = local_52f8.child1;
  local_5090 = local_52f8.child0;
  local_5088 = local_52f8.child0;
  local_5080 = local_52f8.child1;
  local_5070 = local_5308.child1;
  local_5068 = local_5308.child0;
  local_5060 = local_5308.child0;
  local_5058 = local_5308.child1;
  local_5048 = local_5318.child1;
  local_5040 = local_5318.child0;
  local_5038 = local_5318.child0;
  local_5030 = local_5318.child1;
  local_5018 = (char **)local_5328.child0;
  local_5010 = (char **)local_5328.child0;
  local_5008 = *local_5328.child1.child0;
  local_4fe8 = local_5338;
  local_4fe0 = local_5330;
  local_4fd0 = local_5340.child0;
  local_4fc8 = local_5340.child0;
  local_4fb8 = local_5348.child0;
  local_4fb0 = local_5348.child0;
  local_4fa0 = local_5350.child0;
  local_4f98 = local_5350.child0;
  boost::spirit::karma::operator%=(&this->model_,&local_52f8);
  local_4f58 = "import model from \"";
  local_4f60 = &boost::spirit::standard::string;
  local_5370.child0.child0 = (proto_child0)0x1473bcd;
  local_5370.child1 = (proto_child1)&boost::spirit::standard::string;
  local_5360.child0 = &local_5370;
  local_4f88 = "\"\n";
  local_5360.child1.child0 = (proto_child0)0x1473be1;
  local_4f80 = local_5360.child0;
  local_4f78 = local_5360.child0;
  local_4f70 = *local_5360.child1.child0;
  local_4f50 = *local_5370.child0.child0;
  local_4f48 = local_5370.child1;
  boost::spirit::karma::operator%=(&this->import_,&local_5360);
  local_53e0 = &this->annotation_;
  local_4e48 = "typeCollection";
  local_53d8 = "typeCollection";
  local_53f9 = 0x20;
  local_53f8 = &local_53f9;
  local_4de0 = &boost::spirit::standard::string;
  local_53f0 = &boost::spirit::standard::string;
  local_53e8 = &local_53f8;
  local_53d0 = &local_53e0;
  local_53c8 = &local_53e8;
  local_53c0 = &local_53d0;
  local_4e98 = "\n{\n";
  local_53b8 = "\n{\n";
  local_5410 = &this->version_;
  local_4d98 = "  ";
  local_5418 = "  ";
  local_5408 = &local_5418;
  local_53b0.child0 = (proto_child0)&local_53c0;
  local_53b0.child1 = (proto_child1)&local_5408;
  local_5420.child0 = &this->type_definition_;
  local_53a0.child0 = &local_53b0;
  local_53a0.child1 = &local_5420;
  local_5428.child0 = &this->constant_def_;
  local_5390.child0 = &local_53a0;
  local_5390.child1 = &local_5428;
  local_5380.child0 = &local_5390;
  local_4f38 = "}\n";
  local_5380.child1.child0 = (proto_child0)0x147faf0;
  local_4f30 = local_5380.child0;
  local_4f28 = local_5380.child0;
  local_4f20 = local_5380.child1.child0;
  local_4f10 = local_5390.child1;
  local_4f08 = local_5390.child0;
  local_4f00 = local_5390.child0;
  local_4ef8 = local_5390.child1;
  local_4ee8 = local_53a0.child1;
  local_4ee0 = local_53a0.child0;
  local_4ed8 = local_53a0.child0;
  local_4ed0 = local_53a0.child1;
  local_4ec0 = (undefined8 **)local_53b0.child1;
  local_4eb8 = (undefined8 ***)local_53b0.child0;
  local_4eb0 = (undefined8 ***)local_53b0.child0;
  local_4ea8 = (undefined8 **)local_53b0.child1;
  local_4e90 = local_53c0;
  local_4e88 = local_53c0;
  local_4e80 = local_53b8;
  local_4e70 = local_53c8;
  local_4e68 = local_53d0;
  local_4e60 = local_53d0;
  local_4e58 = local_53c8;
  local_4e40 = local_53e0;
  local_4e38 = local_53e0;
  local_4e30 = local_53d8;
  local_4e20 = local_53e8;
  local_4e18 = local_53e8;
  local_4dd8 = local_53f8;
  local_4dd0 = local_53f8;
  local_4dc8 = local_53f0;
  local_4db8 = local_5408;
  local_4db0 = local_5408;
  local_4da0 = local_5410;
  local_4d90 = local_5418;
  local_4d88 = local_5410;
  local_4d60 = local_5420.child0;
  local_4d58 = local_5420.child0;
  local_4d30 = local_5428.child0;
  local_4d28 = local_5428.child0;
  boost::spirit::karma::operator%=(&this->type_collection_,&local_5380);
  local_54f8 = &this->annotation_;
  local_4b38 = "interface ";
  local_54f0 = "interface ";
  local_54e8 = &local_54f8;
  local_4b60 = &boost::spirit::standard::string;
  local_54e0 = &boost::spirit::standard::string;
  local_4af0 = " extends ";
  local_4af8 = &boost::spirit::standard::string;
  local_5510 = " extends ";
  local_5508 = &boost::spirit::standard::string;
  local_5500 = &local_5510;
  local_54d8 = &local_54e8;
  local_54d0 = &local_5500;
  local_5548.child0 = (proto_child0)&boost::spirit::standard::string;
  local_5548.child1.child0 = (proto_child0)0x1473c16;
  local_5538.child1 = &local_5548;
  local_5538.child0.child0 = (proto_child0)0x1473c0c;
  local_4ab8 = &boost::spirit::buffer;
  local_5528.child1 = &local_5538;
  local_4ab0 = &boost::spirit::buffer;
  local_2e38 = &local_2e49;
  local_5528.child0 = (proto_child0)&boost::spirit::buffer;
  local_5518 = &local_5528;
  local_54c8 = &local_54d8;
  local_54c0 = &local_5518;
  local_54b8 = &local_54c8;
  local_4bd8 = "\n{\n";
  local_54b0 = "\n{\n";
  local_5550 = &this->version_;
  local_54a8 = &local_54b8;
  local_54a0 = &local_5550;
  local_5558 = &this->attribute_;
  local_5498 = &local_54a8;
  local_5490 = &local_5558;
  local_5560 = &this->method_;
  local_5488 = &local_5498;
  local_5480 = &local_5560;
  local_5568 = &this->broadcast_;
  local_5478 = &local_5488;
  local_5470 = &local_5568;
  local_5570 = &this->contract_;
  local_5468.child0 = (proto_child0)&local_5478;
  local_5468.child1 = (proto_child1)&local_5570;
  local_5578.child0 = &this->type_definition_;
  local_5458.child0 = &local_5468;
  local_5458.child1 = &local_5578;
  local_5580.child0 = &this->constant_def_;
  local_5448.child0 = &local_5458;
  local_5448.child1 = &local_5580;
  local_5438.child0 = &local_5448;
  local_4d18 = "}\n";
  local_5438.child1.child0 = (proto_child0)0x147faf0;
  local_4d78 = local_5578.child0;
  local_4d70 = local_5578.child0;
  local_4d48 = local_5580.child0;
  local_4d40 = local_5580.child0;
  local_4d10 = local_5438.child0;
  local_4d08 = local_5438.child0;
  local_4d00 = local_5438.child1.child0;
  local_4cf0 = local_5448.child1;
  local_4ce8 = local_5448.child0;
  local_4ce0 = local_5448.child0;
  local_4cd8 = local_5448.child1;
  local_4cc8 = local_5458.child1;
  local_4cc0 = local_5458.child0;
  local_4cb8 = local_5458.child0;
  local_4cb0 = local_5458.child1;
  local_4ca0 = (ContractGenerator **)local_5468.child1;
  local_4c98 = (undefined8 ***)local_5468.child0;
  local_4c90 = (undefined8 ***)local_5468.child0;
  local_4c88 = (ContractGenerator **)local_5468.child1;
  local_4c78 = local_5470;
  local_4c70 = local_5478;
  local_4c68 = local_5478;
  local_4c60 = local_5470;
  local_4c50 = local_5480;
  local_4c48 = local_5488;
  local_4c40 = local_5488;
  local_4c38 = local_5480;
  local_4c28 = local_5490;
  local_4c20 = local_5498;
  local_4c18 = local_5498;
  local_4c10 = local_5490;
  local_4c00 = local_54a0;
  local_4bf8 = local_54a8;
  local_4bf0 = local_54a8;
  local_4be8 = local_54a0;
  local_4bd0 = local_54b8;
  local_4bc8 = local_54b8;
  local_4bc0 = local_54b0;
  local_4bb0 = local_54c0;
  local_4ba8 = local_54c8;
  local_4ba0 = local_54c8;
  local_4b98 = local_54c0;
  local_4b88 = local_54d0;
  local_4b80 = local_54d8;
  local_4b78 = local_54d8;
  local_4b70 = local_54d0;
  local_4b58 = local_54e8;
  local_4b50 = local_54e8;
  local_4b48 = local_54e0;
  local_4b30 = local_54f8;
  local_4b28 = local_54f8;
  local_4b20 = local_54f0;
  local_4b10 = local_5500;
  local_4b08 = local_5500;
  local_4ae8 = local_5510;
  local_4ae0 = local_5508;
  local_4ad0 = local_5518;
  local_4ac8 = local_5518;
  local_4ac0 = local_5528.child1;
  local_2e48 = local_5528.child1;
  local_2e40 = local_5528.child1;
  local_2e28 = local_5518;
  that_44.child0 = local_5518;
  boost::spirit::karma::operator%=<_bbc504e1_>(&this->interface_,&local_5438);
  local_55c0.child0.child0 = (proto_child0)0x1473c19;
  local_55c0.child1 = (proto_child1)&boost::spirit::int_;
  local_55b0.child0 = &local_55c0;
  local_55b0.child1.child0 = (proto_child0)0x1473c2c;
  local_55a0.child0 = &local_55b0;
  local_55a0.child1 = (proto_child1)&boost::spirit::int_;
  local_5590.child0 = &local_55a0;
  local_5590.child1.child0 = (proto_child0)0x147faef;
  boost::spirit::karma::operator%=(&this->version_,&local_5590);
  local_5640 = &this->annotation_;
  local_5638 = "  attribute ";
  local_5628 = &this->type_;
  local_5630 = &local_5640;
  local_565b = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_565a,(bool *)&boost::spirit::bool_,&local_565b);
  local_5658 = local_565a;
  local_5650 = &local_5658;
  local_5648 = "[]";
  local_5620 = &local_5630;
  local_5618 = &local_5650;
  local_565c = 0x20;
  local_5610 = &local_5620;
  local_5608 = &local_565c;
  local_5600.child0 = (proto_child0)&local_5610;
  local_5600.child1 = (proto_child1)&boost::spirit::standard::string;
  local_567b = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_567a,(bool *)&boost::spirit::bool_,&local_567b);
  local_5678 = local_567a;
  local_5670.child0 = (proto_child0)&local_5678;
  local_5670.child1.child0 = (proto_child0)0x1473c44;
  local_55f0.child0 = &local_5600;
  local_55f0.child1 = &local_5670;
  local_569b = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_569a,(bool *)&boost::spirit::bool_,&local_569b);
  local_5698.child0 = (proto_child0)local_569a;
  local_5690.child0 = &local_5698;
  local_5690.child1.child0 = (proto_child0)0x1473c4e;
  local_55e0.child0 = &local_55f0;
  local_55e0.child1 = &local_5690;
  local_55d0.child0 = &local_55e0;
  local_55d0.child1 = (proto_child1)&boost::spirit::eol;
  boost::spirit::karma::operator%=(&this->attribute_,&local_55d0);
  local_5720 = &this->annotation_;
  local_5718 = "  method ";
  local_5710 = &local_5720;
  local_5708 = &boost::spirit::standard::string;
  local_573b = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_573a,(bool *)&boost::spirit::bool_,&local_573b);
  local_5738 = local_573a;
  local_5730 = &local_5738;
  local_5728 = " fireAndForget";
  local_5700 = &local_5710;
  local_56f8 = &local_5730;
  local_56f0 = &local_5700;
  local_56e8 = "\n  {\n";
  local_5760 = &this->argument_list_;
  local_5768 = "    in";
  local_5750 = &local_5768;
  local_5758 = &boost::spirit::buffer;
  local_5748 = &local_5758;
  local_56e0.child0 = (proto_child0)&local_56f0;
  local_56e0.child1 = (proto_child1)&local_5748;
  local_5790.child1 = &this->argument_list_;
  local_5790.child0.child0 = (proto_child0)0x1473c7f;
  local_5780.child1 = &local_5790;
  local_1590 = &local_15c1;
  local_5780.child0 = (proto_child0)&boost::spirit::buffer;
  local_5770.child0 = &local_5780;
  local_56d0.child0 = &local_56e0;
  local_56d0.child1 = &local_5770;
  local_57c8.child1 = &this->error_;
  local_57c8.child0.child0 = (proto_child0)0x1473c87;
  local_57b8.child0 = &local_57c8;
  local_57b8.child1.child0 = (proto_child0)0x147d458;
  local_57a8.child1 = &local_57b8;
  local_1318 = &local_1329;
  local_57a8.child0 = (proto_child0)&boost::spirit::buffer;
  local_5798.child0 = &local_57a8;
  local_56c0.child0 = &local_56d0;
  local_56c0.child1 = &local_5798;
  local_56b0.child0 = &local_56c0;
  local_56b0.child1.child0 = (proto_child0)0x147faee;
  local_15c0 = local_5780.child1;
  local_1598 = local_5780.child1;
  local_1580 = local_5770.child0;
  that_107.child0 = local_5770.child0;
  local_1328 = local_57a8.child1;
  local_1320 = local_57a8.child1;
  local_1308 = local_5798.child0;
  that_114.child0 = local_5798.child0;
  boost::spirit::karma::operator%=<_779a81b9_>(&this->method_,&local_56b0);
  local_57e9 = ' ';
  local_57e8.child0.child0 = &local_57e9;
  local_4e08 = &boost::spirit::standard::string;
  local_57e8.child1 = (proto_child1)&boost::spirit::standard::string;
  local_5830 = &this->enumerator_;
  local_5838 = "      ";
  local_5839 = 10;
  local_5828 = &local_5838;
  local_5820 = &local_5839;
  local_5818.child0 = (proto_child0)&local_5828;
  local_5810.child1 = &local_5818;
  local_5810.child0.child0 = (proto_child0)0x147fa38;
  local_5800.child0 = &local_5810;
  local_5800.child1.child0 = (proto_child0)0x147fab7;
  local_57d8.child0 = &local_57e8;
  local_57d8.child1 = &local_5800;
  local_4e00 = local_57e8.child0.child0;
  local_4df8 = local_57e8.child0.child0;
  local_4df0 = local_57e8.child1;
  boost::spirit::karma::operator%=(&this->error_,&local_57d8);
  local_5868.child1 = &this->expression_;
  local_5868.child0.child0 = (proto_child0)0x1473c91;
  local_5858.child0 = &local_5868;
  local_5850.child1 = &local_5858;
  local_5850.child0 = (proto_child0)&boost::spirit::standard::string;
  boost::spirit::karma::operator%=(&this->enumerator_,&local_5850);
  local_58b8 = "  broadcast ";
  local_58b0 = &boost::spirit::standard::string;
  local_58d3 = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_58d2,(bool *)&boost::spirit::bool_,&local_58d3);
  local_58d0 = local_58d2;
  local_58c8 = &local_58d0;
  local_58c0 = " selective";
  local_58a8.child0 = (proto_child0)&local_58b8;
  local_58a8.child1 = (proto_child1)&local_58c8;
  local_5898.child0 = &local_58a8;
  local_5898.child1.child0 = (proto_child0)0x147fa2a;
  local_58f8 = &this->argument_list_;
  local_5900 = "    out";
  local_58f0.child1 = (proto_child1)&local_5900;
  local_15a0 = &local_15b1;
  local_58f0.child0 = (proto_child0)&boost::spirit::buffer;
  local_58e0.child0 = &local_58f0;
  local_5888.child0 = &local_5898;
  local_5888.child1 = &local_58e0;
  local_5878.child0 = &local_5888;
  local_5878.child1.child0 = (proto_child0)0x147faee;
  local_15b0 = (char **)local_58f0.child1;
  local_15a8 = (char **)local_58f0.child1;
  boost::spirit::karma::operator%=(&this->broadcast_,&local_5878);
  local_5958 = &this->type_;
  local_5960 = "  const ";
  local_597b = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_597a,(bool *)&boost::spirit::bool_,&local_597b);
  local_5978 = local_597a;
  local_5970 = &local_5978;
  local_5968 = "[]";
  local_5950 = &local_5960;
  local_5948 = &local_5970;
  local_5940.child0 = (proto_child0)&local_5950;
  local_5940.child1 = (proto_child1)&boost::spirit::standard::string;
  local_5930.child0 = &local_5940;
  local_5930.child1.child0 = (proto_child0)0x1473c91;
  local_5920.child1 = &this->initializer_;
  local_5920.child0 = &local_5930;
  local_5910.child0 = &local_5920;
  local_5910.child1 = (proto_child1)&boost::spirit::eol;
  boost::spirit::karma::operator%=(&this->constant_def_,&local_5910);
  local_59c0 = &this->argument_;
  local_59c8 = "      ";
  local_59c9 = 10;
  local_59b8.child0 = (proto_child0)&local_59c8;
  local_59b8.child1.child0 = &local_59c9;
  local_59a8.child0 = &local_59b8;
  local_59a0.child1 = &local_59a8;
  local_59a0.child0.child0 = (proto_child0)0x147fa38;
  local_5990.child0 = &local_59a0;
  local_5990.child1.child0 = (proto_child0)0x147faec;
  boost::spirit::karma::operator%=(&this->argument_list_,&local_5990);
  local_5a2b = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_5a2a,(bool *)&boost::spirit::bool_,&local_5a2b);
  local_5a28 = local_5a2a;
  local_5a20 = &local_5a28;
  local_5a18 = "[]";
  local_5a10.child1 = (proto_child1)&local_5a20;
  local_5a2c = ' ';
  local_5a00.child0 = &local_5a10;
  local_5a00.child1.child0 = &local_5a2c;
  local_59f0.child0 = &local_5a00;
  local_59f0.child1 = (proto_child1)&boost::spirit::standard::string;
  local_5a58.child1 = &this->initializer_;
  local_5a58.child0.child0 = (proto_child0)0x1473c91;
  local_5a48.child1 = &local_5a58;
  local_c8 = &local_d9;
  local_5a48.child0 = (proto_child0)&boost::spirit::buffer;
  local_5a38.child0 = &local_5a48;
  local_59e0.child0 = &local_59f0;
  local_59e0.child1 = &local_5a38;
  local_5a10.child0 = &this->type_;
  local_d8 = local_5a48.child1;
  local_d0 = local_5a48.child1;
  local_b8 = local_5a38.child0;
  that_179.child0 = local_5a38.child0;
  boost::spirit::karma::operator%=(&this->argument_,&local_59e0);
  return;
}

Assistant:

ModelGenerator::ModelGenerator() :
		ModelGenerator::base_type(model_)
{
	namespace karma = boost::spirit::karma;

	model_
		%= "package "
		<< karma::string
		<< "\n"
		<< *import_
		<< *type_collection_
		<< *interface_
		;

	import_
		%= "import model from \""
		<< karma::string
		<< "\"\n"
		;

	type_collection_
		%= annotation_
		<< "typeCollection"
		<< -(' ' << karma::string)
		<< "\n{\n"
		<< -("  " << version_)
		<< *type_definition_
		<< *constant_def_
		<< "}\n"
		;

	interface_
		%= annotation_
		<< "interface "
		<< karma::string
		<< -(" extends " << karma::string)
		<< -karma::buffer[" manages " << (karma::string % ", ")]
		<< "\n{\n"
		<< -version_
		<< *attribute_
		<< *method_
		<< *broadcast_
		<< -contract_
		<< *type_definition_
		<< *constant_def_
		<< "}\n"
		;

	version_
		%= "  version { major "
		<< karma::int_
		<< " minor "
		<< karma::int_
		<< " }\n"
		;

	attribute_
		%= annotation_
		<< "  attribute "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< (!karma::bool_(true) | " readonly")
		<< (!karma::bool_(true) | " noSubscriptions")
		<< karma::eol
		;

	method_
		%= annotation_
		<< "  method "
		<< karma::string
		<< (!karma::bool_(true) | " fireAndForget")
		<< "\n  {\n"
		<< -karma::buffer["    in" << argument_list_]
		<< -karma::buffer["    out" << argument_list_]
		<< -karma::buffer["    error" << error_ << "\n"]
		<< "  }\n"
		;

	error_
		%= (' ' << karma::string)
		| ("\n    {\n" << *("      " << enumerator_ << '\n') << "    }")
		;

	enumerator_
		%= karma::string
		<< -(" = " << expression_)
		;

	broadcast_
		%= "  broadcast "
		<< karma::string
		<< (!karma::bool_(true) | " selective")
		<< "\n  {\n"
		<< -karma::buffer["    out" << argument_list_]
		<< "  }\n"
		;

	constant_def_
		%= "  const "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< karma::string
		<< " = "
		<< initializer_
		<< karma::eol
		;

	argument_list_
		%= "\n    {\n"
		<< +("      " << argument_ << '\n')
		<< "    }\n"
		;

	argument_
		%= type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< -karma::buffer[" = " << initializer_]
		;
}